

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

int uv_udp_connect(uv_udp_t *handle,sockaddr *addr)

{
  uint local_24;
  uint addrlen;
  sockaddr *addr_local;
  uv_udp_t *handle_local;
  
  if (handle->type == UV_UDP) {
    if (addr == (sockaddr *)0x0) {
      if ((handle->flags & 0x2000000) == 0) {
        handle_local._4_4_ = -0x6b;
      }
      else {
        handle_local._4_4_ = uv__udp_disconnect(handle);
      }
    }
    else {
      if (addr->sa_family == 2) {
        local_24 = 0x10;
      }
      else {
        if (addr->sa_family != 10) {
          return -0x16;
        }
        local_24 = 0x1c;
      }
      if ((handle->flags & 0x2000000) == 0) {
        handle_local._4_4_ = uv__udp_connect(handle,addr,local_24);
      }
      else {
        handle_local._4_4_ = -0x6a;
      }
    }
  }
  else {
    handle_local._4_4_ = -0x16;
  }
  return handle_local._4_4_;
}

Assistant:

int uv_udp_connect(uv_udp_t* handle, const struct sockaddr* addr) {
  unsigned int addrlen;

  if (handle->type != UV_UDP)
    return UV_EINVAL;

  /* Disconnect the handle */
  if (addr == NULL) {
    if (!(handle->flags & UV_HANDLE_UDP_CONNECTED))
      return UV_ENOTCONN;

    return uv__udp_disconnect(handle);
  }

  if (addr->sa_family == AF_INET)
    addrlen = sizeof(struct sockaddr_in);
  else if (addr->sa_family == AF_INET6)
    addrlen = sizeof(struct sockaddr_in6);
  else
    return UV_EINVAL;

  if (handle->flags & UV_HANDLE_UDP_CONNECTED)
    return UV_EISCONN;

  return uv__udp_connect(handle, addr, addrlen);
}